

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_bs.c
# Opt level: O1

int jpc_bitstream_inalign(jpc_bitstream_t *bitstream,int fillmask,int filldata)

{
  int iVar1;
  long lVar2;
  byte bVar3;
  int n;
  uint uVar4;
  
  iVar1 = bitstream->cnt_;
  n = iVar1;
  if ((iVar1 < 1) && (n = 0, iVar1 == 0)) {
    n = 7;
    if ((char)bitstream->buf_ != -1) {
      n = 0;
    }
  }
  if (n == 0) {
    uVar4 = 0;
    n = 0;
LAB_001191b5:
    if ((char)bitstream->buf_ == -1) {
      lVar2 = jpc_bitstream_getbits(bitstream,7);
      if ((int)(uint)lVar2 < 0) goto LAB_001191eb;
      uVar4 = uVar4 << 7 | (uint)lVar2;
      n = n + 7;
    }
    if (n < 8) {
      bVar3 = 7 - (char)n;
      filldata = filldata >> (bVar3 & 0x1f);
      fillmask = fillmask >> (bVar3 & 0x1f);
    }
    else {
      uVar4 = (int)uVar4 >> ((char)n - 7U & 0x1f);
    }
    uVar4 = (uint)(((filldata ^ uVar4) & fillmask) != 0);
  }
  else {
    lVar2 = jpc_bitstream_getbits(bitstream,n);
    uVar4 = (uint)lVar2;
    if (-1 < (int)uVar4) goto LAB_001191b5;
LAB_001191eb:
    uVar4 = 0xffffffff;
  }
  return uVar4;
}

Assistant:

int jpc_bitstream_inalign(jpc_bitstream_t *bitstream, int fillmask,
  int filldata)
{
	int n;
	int v;
	int u;
	int numfill;
	int m;

	numfill = 7;
	m = 0;
	v = 0;
	if (bitstream->cnt_ > 0) {
		n = bitstream->cnt_;
	} else if (!bitstream->cnt_) {
		n = ((bitstream->buf_ & 0xff) == 0xff) ? 7 : 0;
	} else {
		n = 0;
	}
	if (n > 0) {
		if ((u = jpc_bitstream_getbits(bitstream, n)) < 0) {
			return -1;
		}
		m += n;
		v = (v << n) | u;
	}
	if ((bitstream->buf_ & 0xff) == 0xff) {
		if ((u = jpc_bitstream_getbits(bitstream, 7)) < 0) {
			return -1;
		}
		v = (v << 7) | u;
		m += 7;
	}
	if (m > numfill) {
		v >>= m - numfill;
	} else {
		filldata >>= numfill - m;
		fillmask >>= numfill - m;
	}
	if (((~(v ^ filldata)) & fillmask) != fillmask) {
		/* The actual fill pattern does not match the expected one. */
		return 1;
	}

	return 0;
}